

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar7;
  undefined8 uVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  if (pcVar4 != (char *)0x0) {
    puVar12 = (uint *)(pcVar4 + 4);
    do {
      if (*puVar12 != 0) {
        uVar2 = puVar12[1];
        uVar13 = -(uint)((uVar2 & 0xf) == 0);
        if ((uVar13 & 1) == 0) {
          iVar3 = (buf->Buf).Size;
          iVar6 = iVar3 + -1;
          if (iVar3 == 0) {
            iVar6 = 0;
          }
          ImGuiTextBuffer::reserve(buf,iVar6 + (char)puVar12[3] * 0x32 + 0x1e);
          ImGuiTextBuffer::appendf
                    (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)*puVar12,
                     (ulong)(uint)(int)(char)puVar12[3]);
          fVar1 = (float)puVar12[2];
          if ((fVar1 != 0.0) || (uVar7 = extraout_EAX, NAN(fVar1))) {
            ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
            uVar7 = extraout_EAX_00;
          }
          if ('\0' < (char)puVar12[3]) {
            auVar5._4_4_ = -(uint)((uVar2 & 8) == 0);
            auVar5._0_4_ = uVar13;
            auVar5._8_4_ = -(uint)((uVar2 & 2) == 0);
            auVar5._12_4_ = -(uint)((uVar2 & 4) == 0);
            uVar13 = movmskps(uVar7,auVar5);
            pbVar9 = (byte *)((long)puVar12 + 0x1b);
            uVar11 = 0;
            do {
              ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar11);
              if (*(int *)(pbVar9 + -7) != 0) {
                ImGuiTextBuffer::appendf(buf," UserID=%08X");
              }
              if ((uVar2 & 1) != 0) {
                if ((*pbVar9 & 8) != 0) {
                  ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar9 + -0xb));
                }
                if ((*pbVar9 & 8) == 0) {
                  ImGuiTextBuffer::appendf
                            (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar9 + -0xb));
                }
              }
              if ((byte)((byte)uVar13 >> 3) == 0) {
                ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar9 >> 2 & 1));
              }
              if ((uVar13 & 4) == 0) {
                ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar9[-2]);
              }
              if (((uVar13 & 2) == 0) && ((int)(char)pbVar9[-1] != 0xffffffff)) {
                uVar8 = 0x5e;
                if ((*pbVar9 & 3) == 1) {
                  uVar8 = 0x76;
                }
                ImGuiTextBuffer::appendf(buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar9[-1],uVar8);
              }
              ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
              uVar10 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar10;
              pbVar9 = pbVar9 + 0xc;
            } while ((int)uVar10 < (int)(char)puVar12[3]);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
        }
      }
      puVar12 = (uint *)((long)(int)puVar12[-1] + (long)puVar12);
    } while (puVar12 !=
             (uint *)((ctx->SettingsTables).Buf.Data + (long)(ctx->SettingsTables).Buf.Size + 4));
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}